

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

Bit16s envelope_calcsin0(Bit16u phase,Bit16u envelope)

{
  ushort uVar1;
  ushort local_10;
  ushort local_e;
  Bit16u neg;
  Bit16u out;
  Bit16u envelope_local;
  Bit16u phase_local;
  
  local_10 = 0;
  if ((phase & 0x200) != 0) {
    local_10 = 0xffff;
  }
  if ((phase & 0x100) == 0) {
    local_e = logsinrom[(int)((phase & 0x3ff) & 0xff)];
  }
  else {
    local_e = logsinrom[(int)((phase & 0x3ff) & 0xff ^ 0xff)];
  }
  uVar1 = envelope_calcexp((uint)local_e + (uint)envelope * 8);
  return uVar1 ^ local_10;
}

Assistant:

Bit16s envelope_calcsin0(Bit16u phase, Bit16u envelope) {
	phase &= 0x3ff;
	Bit16u out = 0;
	Bit16u neg = 0;
	if (phase & 0x200) {
		neg = ~0;
	}
	if (phase & 0x100) {
		out = logsinrom[(phase & 0xff) ^ 0xff];
	}
	else {
		out = logsinrom[phase & 0xff];
	}
	return envelope_calcexp(out + (envelope << 3)) ^ neg;
}